

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O1

void __thiscall QTextTable::insertRows(QTextTable *this,int pos,int num)

{
  QTextFormatCollection *this_00;
  uint uVar1;
  QTextTablePrivate *this_01;
  QTextDocumentPrivate *this_02;
  pointer piVar2;
  int iVar3;
  int iVar4;
  int blockFormat;
  ulong uVar5;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long in_FS_OFFSET;
  undefined1 local_78 [16];
  ConstIterator local_68;
  int *local_38;
  
  local_38 = *(int **)(in_FS_OFFSET + 0x28);
  if (0 < num) {
    this_01 = *(QTextTablePrivate **)&(this->super_QTextFrame).super_QTextObject.field_0x8;
    if (this_01->dirty == true) {
      QTextTablePrivate::update(this_01);
    }
    iVar3 = this_01->nRows;
    iVar4 = pos;
    if (iVar3 < pos) {
      iVar4 = iVar3;
    }
    if (pos < 0) {
      iVar4 = iVar3;
    }
    this_02 = (this_01->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
    iVar10 = this_02->editBlock;
    this_02->editBlock = iVar10 + 1;
    if (iVar10 == 0) {
      this_02->revision = this_02->revision + 1;
    }
    this_00 = &this_02->formats;
    if (iVar4 < iVar3 && 0 < iVar4) {
      iVar3 = this_01->nCols;
      if (iVar3 < 1) {
        uVar12 = 0;
        goto LAB_0053a0a2;
      }
      lVar9 = 0;
      iVar10 = 0;
      uVar12 = 0;
      uVar7 = 0xffffffff;
      do {
        uVar8 = iVar3 * iVar4 + lVar9;
        piVar2 = (this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = (long)(this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
        if (uVar11 <= uVar8) {
          insertRows();
LAB_0053a1f8:
          insertRows();
          goto LAB_0053a1fd;
        }
        uVar5 = (ulong)(iVar3 * (iVar4 + -1) + (int)lVar9);
        if (uVar11 <= uVar5) goto LAB_0053a1f8;
        uVar1 = piVar2[uVar8];
        if (uVar1 == piVar2[uVar5]) {
          if (uVar1 != uVar7) {
            local_68._12_4_ = 0xaaaaaaaa;
            local_68.n = uVar1;
            local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_68.pt = &this_02->fragments;
            QTextFormatCollection::format
                      ((QTextFormatCollection *)&stack0xffffffffffffffa8,(int)this_00);
            QTextFormat::toCharFormat((QTextFormat *)local_78);
            QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffa8);
            iVar3 = QTextFormat::intProperty((QTextFormat *)local_78,0x4810);
            iVar3 = iVar3 + num + (uint)(iVar3 == 0);
            if (iVar3 < 2) {
              QTextFormat::clearProperty((QTextFormat *)local_78,0x4810);
            }
            else {
              ::QVariant::QVariant((QVariant *)&stack0xffffffffffffffa8,iVar3);
              QTextFormat::setProperty
                        ((QTextFormat *)local_78,0x4810,(QVariant *)&stack0xffffffffffffffa8);
              ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffa8);
            }
            iVar3 = QFragmentMap<QTextFragmentData>::ConstIterator::position(&local_68);
            QTextDocumentPrivate::setCharFormat
                      (this_02,iVar3,1,(QTextCharFormat *)local_78,SetFormat);
            QTextFormat::~QTextFormat((QTextFormat *)local_78);
          }
          iVar10 = iVar10 + 1;
        }
        else if (uVar12 == 0) {
          uVar12 = uVar1;
        }
        iVar3 = this_01->nCols;
        lVar9 = lVar9 + 1;
        uVar7 = uVar1;
      } while ((int)lVar9 < iVar3);
    }
    else {
      if (iVar4 == 0) {
        puVar6 = (uint *)(this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        if ((uint *)(this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish == puVar6) {
LAB_0053a1fd:
          insertRows();
          goto LAB_0053a202;
        }
      }
      else {
        puVar6 = &(this_01->super_QTextFramePrivate).fragment_end;
      }
      uVar12 = *puVar6;
LAB_0053a0a2:
      iVar10 = 0;
    }
    if (iVar10 < this_01->nCols) {
      local_68.pt = &this_02->fragments;
      local_68._12_4_ = 0xaaaaaaaa;
      local_68.n = uVar12;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormatCollection::format((QTextFormatCollection *)&stack0xffffffffffffffa8,(int)this_00);
      QTextFormat::toCharFormat((QTextFormat *)local_78);
      QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffa8);
      QTextFormat::clearProperty((QTextFormat *)local_78,0x4810);
      QTextFormat::clearProperty((QTextFormat *)local_78,0x4811);
      iVar3 = QFragmentMap<QTextFragmentData>::ConstIterator::position(&local_68);
      iVar4 = QTextFormatCollection::indexForFormat(this_00,(QTextFormat *)local_78);
      QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&stack0xffffffffffffffa8);
      blockFormat = QTextFormatCollection::indexForFormat
                              (this_00,(QTextFormat *)&stack0xffffffffffffffa8);
      QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffa8);
      if (0 < (this_01->nCols - iVar10) * num) {
        iVar13 = 0;
        do {
          QTextDocumentPrivate::insertBlock
                    (this_02,(QChar)0xfdd0,iVar3,blockFormat,iVar4,MoveCursor);
          iVar13 = iVar13 + 1;
        } while (iVar13 < (this_01->nCols - iVar10) * num);
      }
      QTextFormat::~QTextFormat((QTextFormat *)local_78);
    }
    QTextDocumentPrivate::endEditBlock(this_02);
  }
  if (*(int **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0053a202:
  __stack_chk_fail();
}

Assistant:

void QTextTable::insertRows(int pos, int num)
{
    Q_D(QTextTable);
    if (num <= 0)
        return;

    if (d->dirty)
        d->update();

    if (pos > d->nRows || pos < 0)
        pos = d->nRows;

//     qDebug() << "-------- insertRows" << pos << num;
    QTextDocumentPrivate *p = d->pieceTable;
    QTextFormatCollection *c = p->formatCollection();
    p->beginEditBlock();

    int extended = 0;
    int insert_before = 0;
    if (pos > 0 && pos < d->nRows) {
        int lastCell = -1;
        for (int i = 0; i < d->nCols; ++i) {
            int cell = d->grid[pos*d->nCols + i];
            if (cell == d->grid[(pos-1)*d->nCols+i]) {
                // cell spans the insertion place, extend it
                if (cell != lastCell) {
                    QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
                    QTextCharFormat fmt = c->charFormat(it->format);
                    fmt.setTableCellRowSpan(fmt.tableCellRowSpan() + num);
                    p->setCharFormat(it.position(), 1, fmt);
                }
                extended++;
            } else if (!insert_before) {
                insert_before = cell;
            }
            lastCell = cell;
        }
    } else {
        insert_before = (pos == 0 ? d->grid[0] : d->fragment_end);
    }
    if (extended < d->nCols) {
        Q_ASSERT(insert_before);
        QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), insert_before);
        QTextCharFormat fmt = c->charFormat(it->format);
        fmt.setTableCellRowSpan(1);
        fmt.setTableCellColumnSpan(1);
        Q_ASSERT(fmt.objectIndex() == objectIndex());
        int pos = it.position();
        int cfmt = p->formatCollection()->indexForFormat(fmt);
        int bfmt = p->formatCollection()->indexForFormat(QTextBlockFormat());
//         qDebug("inserting %d cells, nCols=%d extended=%d", num*(d->nCols-extended), d->nCols, extended);
        for (int i = 0; i < num*(d->nCols-extended); ++i)
            p->insertBlock(QTextBeginningOfFrame, pos, bfmt, cfmt, QTextUndoCommand::MoveCursor);
    }

//     qDebug() << "-------- end insertRows" << pos << num;
    p->endEditBlock();
}